

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall wabt::interp::Memory::Grow(Memory *this,u64 count)

{
  ulong uVar1;
  ulong uVar2;
  Result RVar3;
  bool bVar4;
  
  uVar1 = (this->type_).limits.max;
  uVar2 = this->pages_;
  bVar4 = uVar1 - count < uVar2;
  if (!bVar4 && uVar1 >= count) {
    this->pages_ = uVar2 + count;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->data_,(uVar2 + count) * 0x10000);
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar4 || uVar1 < count;
  return (Result)RVar3.enum_;
}

Assistant:

Result Memory::Grow(u64 count) {
  u64 new_pages;
  if (CanGrow<u64>(type_.limits, pages_, count, &new_pages)) {
#if WABT_BIG_ENDIAN
    auto old_size = data_.size();
#endif
    pages_ = new_pages;
    data_.resize(new_pages * WABT_PAGE_SIZE);
#if WABT_BIG_ENDIAN
    std::move_backward(data_.begin(), data_.begin() + old_size, data_.end());
    std::fill(data_.begin(), data_.end() - old_size, 0);
#endif
    return Result::Ok;
  }
  return Result::Error;
}